

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O0

void pnga_access_block_grid_ptr(Integer g_a,Integer *index,void *ptr,Integer *ld)

{
  short sVar1;
  int iVar2;
  long in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  long in_RDI;
  int ldim;
  Integer _ndim_5;
  Integer _i_5;
  Integer _itmp_2;
  Integer _index2_2 [7];
  int _i_4;
  int _ndim_4;
  Integer _ndim_3;
  Integer _i_3;
  Integer _itmp_1;
  Integer _index2_1 [7];
  int _i_2;
  int _ndim_2;
  Integer _ndim_1;
  Integer _i_1;
  Integer _itmp;
  Integer _index2 [7];
  int _i;
  int _ndim;
  Integer *mapc;
  Integer ldidx [7];
  Integer ldims [7];
  Integer block_count [7];
  Integer block_idx [7];
  Integer lld [7];
  Integer hi;
  Integer lo;
  Integer j;
  Integer blk_jinc;
  Integer hlf_blk [7];
  Integer blk_ld [7];
  Integer blk_inc [7];
  Integer blk_dim [7];
  Integer blk_num [7];
  Integer proc_index [7];
  Integer last;
  Integer *dims;
  int *proc_grid;
  C_Integer *block_dims;
  C_Integer *num_blocks;
  Integer ndim;
  Integer inode;
  Integer factor;
  Integer offset;
  Integer i;
  Integer handle;
  char *lptr;
  long local_478;
  long local_470;
  long alStackY_468 [8];
  int local_428;
  int local_424;
  long local_420;
  long local_418;
  long local_410;
  long alStackY_408 [8];
  int local_3c8;
  int local_3c4;
  long local_3c0;
  long local_3b8;
  long local_3b0;
  long alStackY_3a8 [8];
  int local_368;
  int local_364;
  C_Integer *local_360;
  long alStackY_358 [8];
  long alStackY_318 [6];
  Integer in_stack_fffffffffffffd18;
  char *in_stack_fffffffffffffd20;
  long alStack_2d8 [8];
  long alStack_298 [8];
  long alStack_258 [8];
  long local_218;
  long local_210;
  long local_208;
  long local_200;
  long alStack_1f8 [8];
  long alStack_1b8 [8];
  long alStack_178 [8];
  long alStack_138 [8];
  long alStack_f8 [8];
  long local_b8 [7];
  long local_80;
  C_Integer *local_78;
  int *local_70;
  C_Integer *local_68;
  C_Integer *local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_20;
  undefined8 *local_18;
  long local_10;
  
  local_30 = in_RDI + 1000;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (((GA[local_30].distr_type != 2) && (GA[local_30].distr_type != 3)) &&
     (GA[local_30].distr_type != 4)) {
    pnga_error(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  }
  local_70 = GA[local_30].nblock;
  local_60 = GA[local_30].num_blocks;
  local_68 = GA[local_30].block_dims;
  local_78 = GA[local_30].dims;
  local_58 = (long)GA[local_30].ndim;
  for (local_38 = 0; local_38 < local_58; local_38 = local_38 + 1) {
    if ((*(long *)(local_10 + local_38 * 8) < 0) ||
       (local_60[local_38] <= *(long *)(local_10 + local_38 * 8))) {
      pnga_error(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    }
  }
  if (GA[local_30].distr_type == 3) {
    local_364 = (int)GA[local_30].ndim;
    for (local_368 = 0; local_368 < local_364; local_368 = local_368 + 1) {
      alStackY_3a8[local_368] =
           *(long *)(local_10 + (long)local_368 * 8) % (long)GA[local_30].nblock[local_368];
    }
    local_50 = alStackY_3a8[local_364 + -1];
    for (local_368 = local_364 + -2; -1 < local_368; local_368 = local_368 + -1) {
      local_50 = local_50 * GA[local_30].nblock[local_368] + alStackY_3a8[local_368];
    }
    sVar1 = GA[local_30].ndim;
    local_3c0 = (long)sVar1;
    local_3b0 = local_50;
    local_b8[0] = local_50 % (long)GA[local_30].nblock[0];
    for (local_3b8 = 1; local_3b8 < sVar1; local_3b8 = local_3b8 + 1) {
      local_3b0 = (local_3b0 - local_b8[local_3b8 + -1]) / (long)GA[local_30].nblock[local_3b8 + -1]
      ;
      local_b8[local_3b8] = local_3b0 % (long)GA[local_30].nblock[local_3b8];
    }
    local_80 = local_58 + -1;
    for (local_38 = 0; local_38 < local_58; local_38 = local_38 + 1) {
      local_210 = *(long *)(local_10 + local_38 * 8) * local_68[local_38] + 1;
      local_218 = (*(long *)(local_10 + local_38 * 8) + 1) * local_68[local_38];
      if (local_78[local_38] < local_218) {
        local_218 = local_78[local_38];
      }
      alStackY_318[local_38] = (local_218 - local_210) + 1;
      if (local_38 < local_80) {
        *(long *)(local_20 + local_38 * 8) = alStackY_318[local_38];
      }
    }
  }
  else if (GA[local_30].distr_type == 4) {
    local_3c4 = (int)GA[local_30].ndim;
    for (local_3c8 = 0; local_3c8 < local_3c4; local_3c8 = local_3c8 + 1) {
      alStackY_408[local_3c8] =
           *(long *)(local_10 + (long)local_3c8 * 8) % (long)GA[local_30].nblock[local_3c8];
    }
    local_50 = alStackY_408[local_3c4 + -1];
    for (local_3c8 = local_3c4 + -2; -1 < local_3c8; local_3c8 = local_3c8 + -1) {
      local_50 = local_50 * GA[local_30].nblock[local_3c8] + alStackY_408[local_3c8];
    }
    sVar1 = GA[local_30].ndim;
    local_420 = (long)sVar1;
    local_410 = local_50;
    local_b8[0] = local_50 % (long)GA[local_30].nblock[0];
    for (local_418 = 1; local_418 < sVar1; local_418 = local_418 + 1) {
      local_410 = (local_410 - local_b8[local_418 + -1]) / (long)GA[local_30].nblock[local_418 + -1]
      ;
      local_b8[local_418] = local_410 % (long)GA[local_30].nblock[local_418];
    }
    local_80 = local_58 + -1;
    local_360 = GA[local_30].mapc;
    local_40 = 0;
    for (local_38 = 0; local_38 < local_58; local_38 = local_38 + 1) {
      alStack_258[local_38] = 0;
      alStackY_358[local_38] = 0;
      local_210 = local_360[local_40 + *(long *)(local_10 + local_38 * 8)];
      if (*(long *)(local_10 + local_38 * 8) < local_60[local_38] + -1) {
        local_218 = local_360[local_40 + *(long *)(local_10 + local_38 * 8) + 1] + -1;
      }
      else {
        local_218 = local_78[local_38];
      }
      alStackY_318[local_38] =
           (local_218 - local_360[local_40 + *(long *)(local_10 + local_38 * 8)]) + 1;
      for (local_208 = local_b8[local_38]; local_208 < local_60[local_38];
          local_208 = local_70[local_38] + local_208) {
        local_210 = local_360[local_40 + local_208];
        if (local_208 < local_60[local_38] + -1) {
          local_218 = local_360[local_40 + local_208 + 1] + -1;
        }
        else {
          local_218 = local_78[local_38];
        }
        alStack_258[local_38] =
             (local_218 - local_360[local_40 + local_208]) + 1 + alStack_258[local_38];
        if (local_208 < *(long *)(local_10 + local_38 * 8)) {
          alStackY_358[local_38] = (local_218 - local_210) + 1 + alStackY_358[local_38];
        }
      }
      if (local_38 < local_80) {
        *(long *)(local_20 + local_38 * 8) = alStackY_318[local_38];
      }
      local_40 = local_60[local_38] + local_40;
    }
  }
  else if (GA[local_30].distr_type == 2) {
    local_424 = (int)GA[local_30].ndim;
    for (local_428 = 0; local_428 < local_424; local_428 = local_428 + 1) {
      alStackY_468[local_428] =
           *(long *)(local_10 + (long)local_428 * 8) % (long)GA[local_30].nblock[local_428];
    }
    local_50 = alStackY_468[local_424 + -1];
    for (local_428 = local_424 + -2; -1 < local_428; local_428 = local_428 + -1) {
      local_50 = local_50 * GA[local_30].nblock[local_428] + alStackY_468[local_428];
    }
    sVar1 = GA[local_30].ndim;
    local_470 = local_50;
    local_b8[0] = local_50 % (long)GA[local_30].nblock[0];
    for (local_478 = 1; local_478 < sVar1; local_478 = local_478 + 1) {
      local_470 = (local_470 - local_b8[local_478 + -1]) / (long)GA[local_30].nblock[local_478 + -1]
      ;
      local_b8[local_478] = local_470 % (long)GA[local_30].nblock[local_478];
    }
    local_80 = local_58 + -1;
    for (local_38 = 0; local_38 < local_80; local_38 = local_38 + 1) {
      alStack_138[local_38] = local_68[local_38] * (long)local_70[local_38];
      alStack_f8[local_38] = GA[local_30].dims[local_38] / alStack_138[local_38];
      alStack_178[local_38] =
           GA[local_30].dims[local_38] - alStack_f8[local_38] * alStack_138[local_38];
      alStack_1b8[local_38] = alStack_f8[local_38] * local_68[local_38];
      alStack_1f8[local_38] = alStack_178[local_38] / local_68[local_38];
      *(long *)(local_20 + local_38 * 8) = alStack_1b8[local_38];
      local_200 = local_78[local_38] % local_68[local_38];
      if (0 < alStack_178[local_38]) {
        if (local_b8[local_38] < alStack_1f8[local_38]) {
          local_200 = local_68[local_38];
        }
        else if (local_b8[local_38] == alStack_1f8[local_38]) {
          local_200 = alStack_178[local_38] % local_68[local_38];
        }
        else {
          local_200 = 0;
        }
      }
      *(long *)(local_20 + local_38 * 8) = local_200 + *(long *)(local_20 + local_38 * 8);
    }
  }
  if (GA[local_30].distr_type == 3) {
    for (local_38 = 0; local_38 < local_58; local_38 = local_38 + 1) {
      alStack_298[local_38] =
           ((*(long *)(local_10 + local_38 * 8) - local_b8[local_38]) + 1) /
           (long)local_70[local_38];
      iVar2 = (int)(((local_60[local_38] - local_b8[local_38]) + 1) / (long)local_70[local_38]);
      if (((local_60[local_38] - local_b8[local_38]) + 1) % (long)local_70[local_38] == 0) {
        if (local_78[local_38] % local_68[local_38] == 0) {
          alStack_258[local_38] = (long)iVar2 * local_68[local_38];
        }
        else {
          alStack_258[local_38] =
               (long)(iVar2 + -1) * local_68[local_38] + local_78[local_38] % local_68[local_38];
        }
      }
      else {
        alStack_258[local_38] = (long)iVar2 * local_68[local_38];
      }
      alStack_2d8[local_38] = (long)iVar2;
    }
    local_40 = 0;
    for (local_38 = 0; local_38 < local_58; local_38 = local_38 + 1) {
      local_48 = 1;
      for (local_208 = 0; local_208 < local_38; local_208 = local_208 + 1) {
        local_48 = alStack_258[local_208] * local_48;
      }
      for (local_208 = local_38; local_208 < local_58; local_208 = local_208 + 1) {
        if ((local_38 < local_208) && (alStack_298[local_208] == alStack_2d8[local_208] + -1)) {
          local_48 = alStackY_318[local_208] * local_48;
        }
        else {
          local_48 = local_68[local_208] * local_48;
        }
      }
      local_40 = alStack_298[local_38] * local_48 + local_40;
    }
  }
  else if (GA[local_30].distr_type == 4) {
    local_40 = 0;
    for (local_38 = 0; local_38 < local_58; local_38 = local_38 + 1) {
      local_48 = 1;
      for (local_208 = 0; local_208 < local_38; local_208 = local_208 + 1) {
        local_48 = alStack_258[local_208] * local_48;
      }
      local_48 = alStackY_358[local_38] * local_48;
      for (local_208 = local_38 + 1; local_208 < local_58; local_208 = local_208 + 1) {
        local_48 = alStackY_318[local_208] * local_48;
      }
      local_40 = local_48 + local_40;
    }
  }
  else if (GA[local_30].distr_type == 2) {
    local_40 = 0;
    local_48 = 1;
    for (local_38 = 0; local_38 < local_58; local_38 = local_38 + 1) {
      local_40 = ((*(long *)(local_10 + local_38 * 8) - local_b8[local_38]) /
                 (long)local_70[local_38]) * local_68[local_38] * local_48 + local_40;
      if (local_38 < local_58 + -1) {
        local_48 = *(long *)(local_20 + local_38 * 8) * local_48;
      }
    }
  }
  *local_18 = GA[local_30].ptr[local_50] + local_40 * GA[local_30].elemsize;
  return;
}

Assistant:

void pnga_access_block_grid_ptr(Integer g_a, Integer *index, void* ptr, Integer *ld)
            /* g_a: array handle [input]
             * index: subscript of a particular block  [input]
             * ptr: pointer to data in block [output]
             * ld:  array of strides for block data [output]
             */
{
  char *lptr;
  Integer  handle = GA_OFFSET + g_a;
  Integer  i/*, p_handle*/, offset, factor, inode;
  Integer ndim;
  C_Integer *num_blocks, *block_dims;
  int *proc_grid;
  Integer *dims;
  Integer last;
  Integer proc_index[MAXDIM];
  Integer blk_num[MAXDIM], blk_dim[MAXDIM], blk_inc[MAXDIM];
  Integer blk_ld[MAXDIM],hlf_blk[MAXDIM],blk_jinc;
  Integer j, lo, hi;
  Integer lld[MAXDIM], block_idx[MAXDIM], block_count[MAXDIM];
  Integer ldims[MAXDIM], ldidx[MAXDIM];
  Integer *mapc;

  
  /*p_handle = GA[handle].p_handle;*/
  if (GA[handle].distr_type != SCALAPACK && GA[handle].distr_type != TILED &&
      GA[handle].distr_type != TILED_IRREG) {
    pnga_error("Array is not using ScaLAPACK or tiled data distribution",0);
  }
  /* dimensions of processor grid */
  proc_grid = GA[handle].nblock;
  /* number of blocks along each dimension */
  num_blocks = GA[handle].num_blocks;
  /* size of individual blocks */
  block_dims = GA[handle].block_dims;
  dims = GA[handle].dims;
  ndim = GA[handle].ndim;
  for (i=0; i<ndim; i++) {
    if (index[i] < 0 || index[i] >= num_blocks[i])
      pnga_error("block index outside allowed values",index[i]);
  }

  /* Find strides of requested block */
  if (GA[handle].distr_type == TILED) {
    /* find out what processor block is located on */
    gam_find_tile_proc_from_indices(handle, inode, index)

    /* get proc indices of processor that owns block */
    gam_find_tile_proc_indices(handle,inode,proc_index)
      last = ndim-1;

    for (i=0; i<ndim; i++)  {
      lo = index[i]*block_dims[i]+1;
      hi = (index[i]+1)*block_dims[i];
      if (hi > dims[i]) hi = dims[i]; 
      ldims[i] = (hi - lo + 1);
      if (i<last) ld[i] = ldims[i];
    }
  } else if (GA[handle].distr_type == TILED_IRREG) {
    /* find out what processor block is located on */
    gam_find_tile_proc_from_indices(handle, inode, index);

    /* get proc indices of processor that owns block */
    gam_find_tile_proc_indices(handle,inode,proc_index)
      last = ndim-1;

    mapc = GA[handle].mapc;
    offset = 0;
    for (i=0; i<ndim; i++) {
      lld[i] = 0;
      ldidx[i] = 0;
      lo = mapc[offset+index[i]];
      if (index[i] < num_blocks[i]-1) {
        hi = mapc[offset+index[i]+1]-1;
      } else {
        hi = dims[i];
      }
      ldims[i] = hi - lo + 1;
      for (j = proc_index[i]; j<num_blocks[i]; j += proc_grid[i]) {
        lo = mapc[offset+j];
        if (j < num_blocks[i]-1) {
          hi = mapc[offset+j+1]-1;
        } else {
          hi = dims[i];
        }
        lld[i] += (hi-lo+1);
        if (j < index[i]) {
          ldidx[i] += (hi-lo+1);
        }
      }
      if (i<last) ld[i] = ldims[i];
      offset += num_blocks[i];
    }
  } else if (GA[handle].distr_type == SCALAPACK) {
    /* find out what processor block is located on */
    gam_find_proc_from_sl_indices(handle, inode, index);

    /* get proc indices of processor that owns block */
    gam_find_proc_indices(handle,inode,proc_index)
      last = ndim-1;
 
    for (i=0; i<last; i++)  {
      blk_dim[i] = block_dims[i]*proc_grid[i];
      blk_num[i] = GA[handle].dims[i]/blk_dim[i];
      blk_inc[i] = GA[handle].dims[i] - blk_num[i]*blk_dim[i];
      blk_ld[i] = blk_num[i]*block_dims[i];
      hlf_blk[i] = blk_inc[i]/block_dims[i];
      ld[i] = blk_ld[i];
      blk_jinc = dims[i]%block_dims[i];
      if (blk_inc[i] > 0) {
        if (proc_index[i]<hlf_blk[i]) {
          blk_jinc = block_dims[i];
        } else if (proc_index[i] == hlf_blk[i]) {
          blk_jinc = blk_inc[i]%block_dims[i];
          /*
          if (blk_jinc == 0) {
          blk_jinc = block_dims[i];
          }
          */
        } else {
          blk_jinc = 0;
        }
      }
      ld[i] += blk_jinc;
    }
  }

  /* Find the local grid index of block relative to local block grid and
     store result in block_idx.
     Find physical dimensions of locally held data and store in 
     lld and set values in ldim, which is used to evaluate the
     offset for the requested block. */
  if (GA[handle].distr_type == TILED) {
    for (i=0; i<ndim; i++) {
      int ldim;
      /*
      block_idx[i] = 0;
      block_count[i] = 0;
      lld[i] = 0;
      lo = 0;
      hi = -1;
      */
      block_idx[i] = (index[i]-proc_index[i]+1)/proc_grid[i];
      ldim = (num_blocks[i]-proc_index[i]+1)/proc_grid[i];
      if ((num_blocks[i]-proc_index[i]+1)%proc_grid[i] == 0) {
        if (dims[i]%block_dims[i] != 0) {
          lld[i] = (ldim-1)*block_dims[i] + dims[i]%block_dims[i];
        } else {
          lld[i] = ldim*block_dims[i];
        }
      } else {
        lld[i] = ldim *block_dims[i];
      }
      block_count[i] = ldim;
      /*
      for (j=proc_index[i]; j<num_blocks[i]; j += proc_grid[i]) {
        lo = j*block_dims[i] + 1;
        hi = (j+1)*block_dims[i];
        if (hi > dims[i]) hi = dims[i]; 
        lld[i] += (hi - lo + 1);
        if (j<index[i]) block_idx[i]++;
        block_count[i]++;
      }
      */
    }

    /* Evaluate offset for requested block. The algorithm used goes like this:
     *    The contribution from the fastest dimension is
     *      block_idx[0]*block_dims[0]*...*block_dims[ndim-1];
     *    The contribution from the second fastest dimension is
     *      block_idx[1]*lld[0]*block_dims[1]*...*block_dims[ndim-1];
     *    The contribution from the third fastest dimension is
     *      block_idx[2]*lld[0]*lld[1]*block_dims[2]*...*block_dims[ndim-1];
     *    etc.
     *    If block_idx[i] is equal to the total number of blocks contained on that
     *    processor minus 1 (the index is at the edge of the array) and the index
     *    i is greater than the index of the dimension, then instead of using the
     *    block dimension, use the fractional dimension of the edge block (which
     *    may be smaller than the block dimension)
     */
    offset = 0;
    for (i=0; i<ndim; i++) {
      factor = 1;
      for (j=0; j<i; j++) {
        factor *= lld[j];
      }
      for (j=i; j<ndim; j++) {
        if (j > i && block_idx[j] == block_count[j]-1) {
          factor *= ldims[j];
        } else {
          factor *= block_dims[j];
        }
      }
      offset += block_idx[i]*factor;
    }
  } else if (GA[handle].distr_type == TILED_IRREG) {
    /* Evaluate offset for requested block. This algorithm is similar to the
     * algorithm for reqularly tiled data layouts.
     *    The contribution from the fastest dimension is
     *      ldidx[0]*ldims[2]*...*ldims[ndim-1];
     *    The contribution from the second fastest dimension is
     *      lld[0]*ldidx[1]*ldims[2]*...*ldims[ndim-1];
     *    The contribution from the third fastest dimension is
     *      lld[0]*lld[1]*ldidx[2]*ldims[3]*...*ldims[ndim-1];
     *    etc.
     */
    offset = 0;
    for (i=0; i<ndim; i++) {
      factor = 1;
      for (j=0; j<i; j++) {
        factor *= lld[j];
      }
      factor *= ldidx[i];
      for (j=i+1; j<ndim; j++) {
        factor *= ldims[j];
      }
      offset += factor;
    }
  } else if (GA[handle].distr_type == SCALAPACK) {
    /* Evalauate offset for block */
    offset = 0;
    factor = 1;
    for (i = 0; i<ndim; i++) {
      offset += ((index[i]-proc_index[i])/proc_grid[i])*block_dims[i]*factor;
      if (i<ndim-1) factor *= ld[i];
    }
  }

  lptr = GA[handle].ptr[inode]+offset*GA[handle].elemsize;

  *(char**)ptr = lptr; 
}